

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void getBundlePart(char *fullpath,uint length,uint *newLength)

{
  int iVar1;
  char *potentialBundleStart;
  uint *newLength_local;
  uint length_local;
  char *fullpath_local;
  
  if (newLength != (uint *)0x0) {
    if ((fullpath == (char *)0x0) || (length == 0)) {
      *newLength = 0;
    }
    else {
      iVar1 = strncmp(fullpath + ((ulong)length - 0xf),"/Contents/MacOS",0xf);
      if (iVar1 == 0) {
        *newLength = length - 0xf;
      }
      else {
        *newLength = 0;
      }
    }
  }
  return;
}

Assistant:

void getBundlePart(const char * fullpath, unsigned int length, unsigned int * newLength)
{
    if (newLength == 0x0)
    {
        return;
    }

    if (fullpath == 0x0 || length == 0)
    {
        *newLength = 0;

        return;
    }

    // check for /Contents/MacOS
    const char * potentialBundleStart = fullpath + length - macOSBundlePathLength;

    if (strncmp(potentialBundleStart, macOSBundlePath, macOSBundlePathLength) != 0)
    {
        // No bundle
        *newLength = 0;

        return;
    }

    *newLength = length - macOSBundlePathLength;
}